

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::promoteScalar(Builder *this,Decoration precision,Id *left,Id *right)

{
  int iVar1;
  int iVar2;
  Id IVar3;
  Id IVar4;
  int direction;
  Id *right_local;
  Id *left_local;
  Decoration precision_local;
  Builder *this_local;
  
  iVar1 = getNumComponents(this,*right);
  iVar2 = getNumComponents(this,*left);
  if (iVar1 - iVar2 < 1) {
    if (iVar1 - iVar2 < 0) {
      IVar4 = *right;
      IVar3 = getTypeId(this,*right);
      iVar1 = getNumComponents(this,*left);
      IVar3 = makeVectorType(this,IVar3,iVar1);
      IVar4 = smearScalar(this,precision,IVar4,IVar3);
      *right = IVar4;
    }
  }
  else {
    IVar4 = *left;
    IVar3 = getTypeId(this,*left);
    iVar1 = getNumComponents(this,*right);
    IVar3 = makeVectorType(this,IVar3,iVar1);
    IVar4 = smearScalar(this,precision,IVar4,IVar3);
    *left = IVar4;
  }
  return;
}

Assistant:

void Builder::promoteScalar(Decoration precision, Id& left, Id& right)
{
    int direction = getNumComponents(right) - getNumComponents(left);

    if (direction > 0)
        left = smearScalar(precision, left, makeVectorType(getTypeId(left), getNumComponents(right)));
    else if (direction < 0)
        right = smearScalar(precision, right, makeVectorType(getTypeId(right), getNumComponents(left)));

    return;
}